

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

void __thiscall Polynom<Finite>::strip(Polynom<Finite> *this)

{
  pointer *ppuVar1;
  uint uVar2;
  uint x2;
  uint uVar3;
  Matrix<Finite> local_20;
  
  uVar3 = (this->m).N - 1;
  if (uVar3 == 0) {
    x2 = 0;
  }
  else {
    ppuVar1 = &(((this->m).arr)->val).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar2 = 0;
    do {
      x2 = uVar2;
      if (((_Vector_impl_data *)(ppuVar1 + -1))->_M_start != *ppuVar1) break;
      uVar2 = uVar2 + 1;
      ppuVar1 = ppuVar1 + 4;
      x2 = uVar3;
    } while (uVar3 != uVar2);
  }
  if (x2 != 0) {
    Matrix<Finite>::submatrix(&local_20,(uint)this,0,x2,0);
    Matrix<Finite>::operator=(&this->m,&local_20);
    Matrix<Finite>::~Matrix(&local_20);
  }
  return;
}

Assistant:

void Polynom<Field>::strip()
{
    unsigned p = 0;
    while(p < m.width() - 1 && !m[0][p])
        ++p;
    if(p)
        m = m.submatrix(0, p, 0, m.width() - 1);
}